

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::anon_unknown_2::
         LegacyGeneratedClassName<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc)

{
  Descriptor *pDVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string classname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&classname,*(string **)(desc + 8));
  pDVar1 = desc;
  while (pDVar1 = *(Descriptor **)(pDVar1 + 0x18), pDVar1 != (Descriptor *)0x0) {
    std::operator+(&local_50,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (pDVar1 + 8),'_');
    std::operator+(&local_90,&local_50,&classname);
    std::__cxx11::string::operator=((string *)&classname,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  ClassNamePrefix<google::protobuf::Descriptor>(&local_90,&classname,desc);
  std::operator+(__return_storage_ptr__,&local_90,&classname);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&classname);
  return __return_storage_ptr__;
}

Assistant:

std::string LegacyGeneratedClassName(const DescriptorType* desc) {
  std::string classname = desc->name();
  const Descriptor* containing = desc->containing_type();
  while (containing != NULL) {
    classname = containing->name() + '_' + classname;
    containing = containing->containing_type();
  }
  return ClassNamePrefix(classname, desc) + classname;
}